

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_set_update5_info(Integer g_a)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  C_Integer *pCVar10;
  global_array_t *pgVar11;
  ushort uVar12;
  int _d;
  Integer proc;
  logical lVar13;
  double *pdVar14;
  long lVar15;
  Integer *map;
  Integer *proclist;
  size_t sVar16;
  Integer IVar17;
  long lVar18;
  long lVar19;
  ushort uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  C_Integer CVar25;
  long lVar26;
  int *piVar27;
  long ndim;
  long lVar28;
  long lVar29;
  char *pcVar30;
  Integer IVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  double *local_5b0;
  int local_598;
  int _index [7];
  Integer _hi [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer plo_loc [7];
  Integer phi_rem [7];
  Integer width [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar13 = pnga_has_ghosts(g_a);
  if (lVar13 != 0) {
    lVar13 = gai_check_ghost_distr(g_a);
    pgVar11 = GA;
    if (lVar13 == 0) {
      return 0;
    }
    lVar1 = g_a + 1000;
    ndim = (long)GA[lVar1].ndim;
    iVar5 = GA[lVar1].p_handle;
    iVar6 = GA[lVar1].elemsize;
    pdVar14 = (double *)malloc(ndim * 0x50);
    pgVar11[lVar1].cache = pdVar14;
    local_5b0 = GA[lVar1].cache;
    iVar7 = GA[lVar1].corner_flag;
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    IVar31 = GAnproc;
    lVar15 = 0;
    lVar34 = 0;
    if (0 < ndim) {
      lVar34 = ndim;
    }
    for (; lVar34 * 8 - lVar15 != 0; lVar15 = lVar15 + 8) {
      *(undefined8 *)((long)increment + lVar15) = 0;
      *(undefined8 *)((long)width + lVar15) = *(undefined8 *)((long)GA[g_a + 1000].width + lVar15);
      *(undefined8 *)((long)dims + lVar15) = *(undefined8 *)((long)GA[g_a + 1000].dims + lVar15);
      if ((*(long *)((long)lo_loc + lVar15) == 0) && (*(long *)((long)hi_loc + lVar15) == -1)) {
        *local_5b0 = 0.0;
        return 0;
      }
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_set_update5_info:malloc failed (_ga_map)",0);
      IVar31 = GAnproc;
    }
    proclist = (Integer *)malloc(IVar31 << 3);
    if (proclist == (Integer *)0x0) {
      pnga_error("pnga_set_update5_info:malloc failed (_ga_proclist)",0);
    }
    local_598 = (int)proc;
    lVar15 = 1;
    if (1 < ndim) {
      lVar15 = ndim;
    }
    lVar15 = lVar15 * 4 + -4;
    for (IVar31 = 0; IVar31 != lVar34; IVar31 = IVar31 + 1) {
      lVar9 = width[IVar31];
      if (lVar9 != 0) {
        get_remote_block_neg(IVar31,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
        lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
        if (lVar13 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar16 = strlen(err_string);
          sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
          sVar16 = strlen(err_string);
          lVar26 = 1;
          while( true ) {
            IVar17 = pnga_ndim(g_a);
            pcVar30 = err_string + (int)sVar16;
            if (IVar17 <= lVar26) break;
            sprintf(pcVar30,",%ld:%ld ",slo_rem[lVar26],shi_rem[lVar26]);
            sVar16 = strlen(err_string);
            lVar26 = lVar26 + 1;
          }
          pcVar30[0] = ']';
          pcVar30[1] = '\0';
          pnga_error(err_string,g_a);
        }
        piVar27 = (int *)((long)local_5b0 + ndim * 4 + 0x10);
        piVar2 = piVar27 + ndim;
        plVar3 = (long *)(piVar2 + ndim);
        lVar26 = *proclist;
        *plVar3 = lVar26;
        if (-1 < iVar5) {
          lVar26 = (long)PGRP_LIST[iVar5].inv_map_proc_list[lVar26];
          *plVar3 = lVar26;
        }
        pnga_distribution(g_a,lVar26,tlo_rem,thi_rem);
        pgVar11 = GA;
        for (lVar26 = 0; lVar34 != lVar26; lVar26 = lVar26 + 1) {
          if (increment[lVar26] == 0) {
            if (IVar31 == lVar26) {
              lVar22 = width[IVar31];
              plo_rem[IVar31] = lVar22 + (thi_rem[IVar31] - tlo_rem[IVar31]) + 1;
              phi_rem[IVar31] = (thi_rem[IVar31] - tlo_rem[IVar31]) + lVar22 * 2;
              plo_loc[IVar31] = lVar22;
            }
            else {
              lVar22 = width[lVar26];
              plo_rem[lVar26] = lVar22;
              phi_rem[lVar26] = (thi_rem[lVar26] + lVar22) - tlo_rem[lVar26];
              plo_loc[lVar26] = lVar22;
            }
          }
          else {
            plo_rem[lVar26] = 0;
            phi_rem[lVar26] = (increment[lVar26] + thi_rem[lVar26]) - tlo_rem[lVar26];
            plo_loc[lVar26] = 0;
          }
        }
        uVar20 = GA[lVar1].ndim;
        lVar26 = (long)(short)uVar20;
        iVar33 = GA[lVar1].distr_type;
        if (iVar33 - 1U < 3) {
          lVar21 = (long)local_598 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar17 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < lVar26) {
            IVar17 = (long)((int)IVar17 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar22];
            lVar21 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar21;
            lVar22 = lVar22 + 1;
          }
          uVar12 = 0;
          if (0 < (short)uVar20) {
            uVar12 = uVar20;
          }
          for (lVar22 = 0; (ulong)uVar12 * 4 != lVar22; lVar22 = lVar22 + 4) {
            iVar32 = *(int *)((long)_index + lVar22);
            lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
            *(long *)(err_string + lVar22 * 2) = lVar21 * iVar32 + 1;
            lVar21 = ((long)iVar32 + 1) * lVar21;
            lVar18 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
            if (lVar18 <= lVar21) {
              lVar21 = lVar18;
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar21;
          }
        }
        else if (iVar33 == 4) {
          lVar21 = (long)local_598 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar17 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < lVar26) {
            IVar17 = (long)((int)IVar17 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar22];
            lVar21 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar21;
            lVar22 = lVar22 + 1;
          }
          lVar22 = 0;
          uVar12 = 0;
          if (0 < (short)uVar20) {
            uVar12 = uVar20;
          }
          iVar32 = 0;
          for (; (ulong)uVar12 * 4 != lVar22; lVar22 = lVar22 + 4) {
            pCVar10 = GA[lVar1].mapc;
            iVar8 = *(int *)((long)_index + lVar22);
            lVar18 = (long)iVar32 + (long)iVar8;
            *(C_Integer *)(err_string + lVar22 * 2) = pCVar10[lVar18];
            lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar22 * 2);
            if ((long)iVar8 < lVar21 + -1) {
              lVar18 = pCVar10[lVar18 + 1] + -1;
            }
            else {
              lVar18 = *(long *)((long)GA[lVar1].dims + lVar22 * 2);
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar18;
            iVar32 = iVar32 + (int)lVar21;
          }
        }
        else if (iVar33 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar22 = 0;
            if (0 < lVar26) {
              lVar22 = lVar26;
            }
            lVar21 = 1;
            for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
            }
            if ((proc < 0) || (lVar21 <= proc)) {
              for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar21 = 0;
              IVar17 = proc;
              for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
                lVar23 = (long)GA[g_a + 1000].nblock[lVar18];
                lVar19 = IVar17 % lVar23;
                pCVar10 = GA[lVar1].mapc;
                plo_loc[lVar18 + -0x20] = pCVar10[lVar19 + lVar21];
                if (lVar19 == lVar23 + -1) {
                  CVar25 = GA[g_a + 1000].dims[lVar18];
                }
                else {
                  CVar25 = pCVar10[lVar19 + lVar21 + 1] + -1;
                }
                lVar21 = lVar21 + lVar23;
                _hi[lVar18] = CVar25;
                IVar17 = IVar17 / lVar23;
              }
            }
          }
          else if (proc < GA[lVar1].num_rstrctd) {
            lVar22 = 0;
            if (0 < lVar26) {
              lVar22 = lVar26;
            }
            lVar21 = 1;
            for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
            }
            if ((proc < 0) || (lVar21 <= proc)) {
              for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar21 = 0;
              IVar17 = proc;
              for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
                lVar23 = (long)GA[g_a + 1000].nblock[lVar18];
                lVar19 = IVar17 % lVar23;
                pCVar10 = GA[lVar1].mapc;
                plo_loc[lVar18 + -0x20] = pCVar10[lVar19 + lVar21];
                if (lVar19 == lVar23 + -1) {
                  CVar25 = GA[g_a + 1000].dims[lVar18];
                }
                else {
                  CVar25 = pCVar10[lVar19 + lVar21 + 1] + -1;
                }
                lVar21 = lVar21 + lVar23;
                _hi[lVar18] = CVar25;
                IVar17 = IVar17 / lVar23;
              }
            }
          }
          else {
            iVar32 = 0;
            if (0 < (short)uVar20) {
              iVar32 = (int)(short)uVar20;
            }
            for (lVar22 = 0; iVar32 != lVar22; lVar22 = lVar22 + 1) {
              plo_loc[lVar22 + -0x20] = 0;
              _hi[lVar22] = -1;
            }
          }
        }
        lVar22 = lVar26 + -1;
        if (lVar22 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        lVar21 = 0;
        if (0 < lVar22) {
          lVar21 = lVar22;
        }
        lVar19 = 0;
        lVar18 = 1;
        for (lVar23 = 0; lVar21 != lVar23; lVar23 = lVar23 + 1) {
          lVar19 = lVar19 + plo_loc[lVar23] * lVar18;
          lVar28 = (_hi[lVar23] - plo_loc[lVar23 + -0x20]) + GA[g_a + 1000].width[lVar23] * 2 + 1;
          ld_loc[lVar23] = lVar28;
          lVar18 = lVar18 * lVar28;
        }
        iVar32 = GA[lVar1].elemsize;
        local_5b0[1] = (double)(GA[lVar1].ptr[proc] +
                               (lVar18 * plo_loc[lVar26 + -1] + lVar19) * (long)iVar32);
        if (iVar33 - 1U < 3) {
          lVar18 = *plVar3;
          lVar23 = (long)(int)lVar18 % pgVar11[lVar1].num_blocks[0];
          _index[0] = (int)lVar23;
          lVar19 = 0;
          while (lVar19 + 1 < lVar26) {
            lVar18 = (long)((int)lVar18 - (int)lVar23) / pgVar11[g_a + 1000].num_blocks[lVar19];
            lVar23 = (long)(int)lVar18 % pgVar11[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar23;
            lVar19 = lVar19 + 1;
          }
          uVar12 = 0;
          if (0 < (short)uVar20) {
            uVar12 = uVar20;
          }
          for (lVar18 = 0; (ulong)uVar12 * 4 != lVar18; lVar18 = lVar18 + 4) {
            iVar33 = *(int *)((long)_index + lVar18);
            lVar19 = *(long *)((long)pgVar11[g_a + 1000].block_dims + lVar18 * 2);
            *(long *)(err_string + lVar18 * 2) = lVar19 * iVar33 + 1;
            lVar19 = ((long)iVar33 + 1) * lVar19;
            lVar23 = *(long *)((long)pgVar11[g_a + 1000].dims + lVar18 * 2);
            if (lVar23 <= lVar19) {
              lVar19 = lVar23;
            }
            *(long *)((long)_hi + lVar18 * 2) = lVar19;
          }
        }
        else if (iVar33 == 4) {
          lVar18 = *plVar3;
          lVar23 = (long)(int)lVar18 % pgVar11[lVar1].num_blocks[0];
          _index[0] = (int)lVar23;
          lVar19 = 0;
          while (lVar19 + 1 < lVar26) {
            lVar18 = (long)((int)lVar18 - (int)lVar23) / pgVar11[g_a + 1000].num_blocks[lVar19];
            lVar23 = (long)(int)lVar18 % pgVar11[g_a + 1000].num_blocks[lVar19 + 1];
            _index[lVar19 + 1] = (int)lVar23;
            lVar19 = lVar19 + 1;
          }
          lVar18 = 0;
          if ((short)uVar20 < 1) {
            uVar20 = 0;
          }
          iVar33 = 0;
          for (; (ulong)uVar20 * 4 != lVar18; lVar18 = lVar18 + 4) {
            pCVar10 = pgVar11[lVar1].mapc;
            iVar8 = *(int *)((long)_index + lVar18);
            lVar23 = (long)iVar33 + (long)iVar8;
            *(C_Integer *)(err_string + lVar18 * 2) = pCVar10[lVar23];
            lVar19 = *(long *)((long)pgVar11[lVar1].num_blocks + lVar18 * 2);
            if ((long)iVar8 < lVar19 + -1) {
              lVar23 = pCVar10[lVar23 + 1] + -1;
            }
            else {
              lVar23 = *(long *)((long)pgVar11[lVar1].dims + lVar18 * 2);
            }
            *(long *)((long)_hi + lVar18 * 2) = lVar23;
            iVar33 = iVar33 + (int)lVar19;
          }
        }
        else if (iVar33 == 0) {
          if (pgVar11[lVar1].num_rstrctd == 0) {
            lVar18 = lVar26;
            if (lVar26 < 1) {
              lVar18 = 0;
            }
            lVar19 = 1;
            for (lVar23 = 0; lVar18 != lVar23; lVar23 = lVar23 + 1) {
              lVar19 = lVar19 * pgVar11[g_a + 1000].nblock[lVar23];
            }
            lVar23 = *plVar3;
            if (lVar23 < lVar19 && -1 < lVar23) {
              lVar19 = 0;
              for (lVar28 = 0; lVar18 != lVar28; lVar28 = lVar28 + 1) {
                lVar29 = (long)pgVar11[g_a + 1000].nblock[lVar28];
                lVar24 = lVar23 % lVar29;
                pCVar10 = pgVar11[lVar1].mapc;
                plo_loc[lVar28 + -0x20] = pCVar10[lVar24 + lVar19];
                if (lVar24 == lVar29 + -1) {
                  CVar25 = pgVar11[g_a + 1000].dims[lVar28];
                }
                else {
                  CVar25 = pCVar10[lVar24 + lVar19 + 1] + -1;
                }
                lVar19 = lVar19 + lVar29;
                _hi[lVar28] = CVar25;
                lVar23 = lVar23 / lVar29;
              }
            }
            else {
              for (lVar19 = 0; lVar18 != lVar19; lVar19 = lVar19 + 1) {
                plo_loc[lVar19 + -0x20] = 0;
                _hi[lVar19] = -1;
              }
            }
          }
          else {
            lVar18 = *plVar3;
            if (lVar18 < pgVar11[lVar1].num_rstrctd) {
              lVar19 = lVar26;
              if (lVar26 < 1) {
                lVar19 = 0;
              }
              lVar23 = 1;
              for (lVar28 = 0; lVar19 != lVar28; lVar28 = lVar28 + 1) {
                lVar23 = lVar23 * pgVar11[g_a + 1000].nblock[lVar28];
              }
              if ((lVar18 < 0) || (lVar23 <= lVar18)) {
                for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
                  plo_loc[lVar18 + -0x20] = 0;
                  _hi[lVar18] = -1;
                }
              }
              else {
                lVar23 = 0;
                for (lVar28 = 0; lVar19 != lVar28; lVar28 = lVar28 + 1) {
                  lVar29 = (long)pgVar11[g_a + 1000].nblock[lVar28];
                  lVar24 = lVar18 % lVar29;
                  pCVar10 = pgVar11[lVar1].mapc;
                  plo_loc[lVar28 + -0x20] = pCVar10[lVar24 + lVar23];
                  if (lVar24 == lVar29 + -1) {
                    CVar25 = pgVar11[g_a + 1000].dims[lVar28];
                  }
                  else {
                    CVar25 = pCVar10[lVar24 + lVar23 + 1] + -1;
                  }
                  lVar23 = lVar23 + lVar29;
                  _hi[lVar28] = CVar25;
                  lVar18 = lVar18 / lVar29;
                }
              }
            }
            else {
              iVar33 = 0;
              if (0 < (short)uVar20) {
                iVar33 = (int)(short)uVar20;
              }
              for (lVar18 = 0; iVar33 != lVar18; lVar18 = lVar18 + 1) {
                plo_loc[lVar18 + -0x20] = 0;
                _hi[lVar18] = -1;
              }
            }
          }
        }
        if (lVar22 == 0) {
          ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
        }
        lVar18 = 0;
        lVar22 = 1;
        for (lVar19 = 0; lVar21 != lVar19; lVar19 = lVar19 + 1) {
          lVar18 = lVar18 + plo_rem[lVar19] * lVar22;
          lVar23 = (_hi[lVar19] - plo_loc[lVar19 + -0x20]) + pgVar11[g_a + 1000].width[lVar19] * 2 +
                   1;
          ld_rem[lVar19] = lVar23;
          lVar22 = lVar22 * lVar23;
        }
        *local_5b0 = (double)(pgVar11[lVar1].ptr[*plVar3] +
                             (lVar22 * plo_rem[lVar26 + -1] + lVar18) * (long)iVar32);
        *(int *)(local_5b0 + 2) = iVar6;
        *piVar27 = iVar6;
        for (lVar26 = 0; lVar15 != lVar26; lVar26 = lVar26 + 4) {
          *(int *)((long)piVar27 + lVar26) =
               *(int *)((long)piVar27 + lVar26) * *(int *)((long)ld_rem + lVar26 * 2);
          *(int *)((long)local_5b0 + lVar26 + 0x10) =
               *(int *)((long)local_5b0 + lVar26 + 0x10) * *(int *)((long)ld_loc + lVar26 * 2);
          *(undefined4 *)((long)local_5b0 + lVar26 + ndim * 4 + 0x14) =
               *(undefined4 *)((long)piVar27 + lVar26);
          *(undefined4 *)((long)local_5b0 + lVar26 + 0x14) =
               *(undefined4 *)((long)local_5b0 + lVar26 + 0x10);
        }
        for (lVar26 = 0; lVar34 != lVar26; lVar26 = lVar26 + 1) {
          piVar2[lVar26] = ((int)phi_rem[lVar26] - (int)plo_rem[lVar26]) + 1;
        }
        *piVar2 = *piVar2 * iVar6;
        if (-1 < iVar5) {
          *plVar3 = (long)PGRP_LIST[iVar5].inv_map_proc_list[*plVar3];
        }
        get_remote_block_pos(IVar31,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
        lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
        if (lVar13 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA[lVar1].name);
          sVar16 = strlen(err_string);
          sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
          sVar16 = strlen(err_string);
          lVar26 = 1;
          while( true ) {
            IVar17 = pnga_ndim(g_a);
            pcVar30 = err_string + (int)sVar16;
            if (IVar17 <= lVar26) break;
            sprintf(pcVar30,",%ld:%ld ",slo_rem[lVar26],shi_rem[lVar26]);
            sVar16 = strlen(err_string);
            lVar26 = lVar26 + 1;
          }
          pcVar30[0] = ']';
          pcVar30[1] = '\0';
          pnga_error(err_string,g_a);
        }
        piVar27 = (int *)((long)plVar3 + ndim * 4 + 0x18);
        piVar2 = piVar27 + ndim;
        plVar4 = (long *)(piVar2 + ndim);
        lVar26 = *proclist;
        *plVar4 = lVar26;
        if (-1 < iVar5) {
          lVar26 = (long)PGRP_LIST[iVar5].inv_map_proc_list[lVar26];
          *plVar4 = lVar26;
        }
        pnga_distribution(g_a,lVar26,tlo_rem,thi_rem);
        for (lVar26 = 0; lVar34 != lVar26; lVar26 = lVar26 + 1) {
          if (increment[lVar26] == 0) {
            if (IVar31 == lVar26) {
              plo_rem[IVar31] = 0;
              phi_rem[IVar31] = width[IVar31] + -1;
              plo_loc[IVar31] = (width[IVar31] + -1 + hi_loc[IVar31]) - lo_loc[IVar31];
            }
            else {
              lVar22 = width[lVar26];
              plo_rem[lVar26] = lVar22;
              phi_rem[lVar26] = (thi_rem[lVar26] + lVar22) - tlo_rem[lVar26];
              plo_loc[lVar26] = lVar22;
            }
          }
          else {
            plo_rem[lVar26] = 0;
            phi_rem[lVar26] = (increment[lVar26] + thi_rem[lVar26]) - tlo_rem[lVar26];
            plo_loc[lVar26] = 0;
          }
        }
        uVar20 = GA[lVar1].ndim;
        lVar26 = (long)(short)uVar20;
        iVar33 = GA[lVar1].distr_type;
        if (iVar33 - 1U < 3) {
          lVar21 = (long)(int)GAme % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar17 = GAme;
          lVar22 = 0;
          while (lVar22 + 1 < lVar26) {
            IVar17 = (long)((int)IVar17 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar22];
            lVar21 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar21;
            lVar22 = lVar22 + 1;
          }
          uVar12 = 0;
          if (0 < (short)uVar20) {
            uVar12 = uVar20;
          }
          for (lVar22 = 0; (ulong)uVar12 * 4 != lVar22; lVar22 = lVar22 + 4) {
            iVar33 = *(int *)((long)_index + lVar22);
            lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
            *(long *)(err_string + lVar22 * 2) = lVar21 * iVar33 + 1;
            lVar21 = ((long)iVar33 + 1) * lVar21;
            lVar18 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
            if (lVar18 <= lVar21) {
              lVar21 = lVar18;
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar21;
          }
        }
        else if (iVar33 == 4) {
          lVar21 = (long)(int)GAme % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar21;
          IVar17 = GAme;
          lVar22 = 0;
          while (lVar22 + 1 < lVar26) {
            IVar17 = (long)((int)IVar17 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar22];
            lVar21 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar22 + 1];
            _index[lVar22 + 1] = (int)lVar21;
            lVar22 = lVar22 + 1;
          }
          lVar22 = 0;
          uVar12 = 0;
          if (0 < (short)uVar20) {
            uVar12 = uVar20;
          }
          iVar33 = 0;
          for (; (ulong)uVar12 * 4 != lVar22; lVar22 = lVar22 + 4) {
            pCVar10 = GA[lVar1].mapc;
            iVar32 = *(int *)((long)_index + lVar22);
            lVar18 = (long)iVar33 + (long)iVar32;
            *(C_Integer *)(err_string + lVar22 * 2) = pCVar10[lVar18];
            lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar22 * 2);
            if ((long)iVar32 < lVar21 + -1) {
              lVar18 = pCVar10[lVar18 + 1] + -1;
            }
            else {
              lVar18 = *(long *)((long)GA[lVar1].dims + lVar22 * 2);
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar18;
            iVar33 = iVar33 + (int)lVar21;
          }
        }
        else if (iVar33 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar22 = 0;
            if (0 < lVar26) {
              lVar22 = lVar26;
            }
            lVar21 = 1;
            for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
            }
            if (GAme < lVar21 && -1 < GAme) {
              lVar21 = 0;
              IVar17 = GAme;
              for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
                lVar23 = (long)GA[g_a + 1000].nblock[lVar18];
                lVar19 = IVar17 % lVar23;
                pCVar10 = GA[lVar1].mapc;
                plo_loc[lVar18 + -0x20] = pCVar10[lVar19 + lVar21];
                if (lVar19 == lVar23 + -1) {
                  CVar25 = GA[g_a + 1000].dims[lVar18];
                }
                else {
                  CVar25 = pCVar10[lVar19 + lVar21 + 1] + -1;
                }
                lVar21 = lVar21 + lVar23;
                _hi[lVar18] = CVar25;
                IVar17 = IVar17 / lVar23;
              }
            }
            else {
              for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
          }
          else if (GAme < GA[lVar1].num_rstrctd) {
            lVar22 = 0;
            if (0 < lVar26) {
              lVar22 = lVar26;
            }
            lVar21 = 1;
            for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
            }
            if ((GAme < 0) || (lVar21 <= GAme)) {
              for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
            else {
              lVar21 = 0;
              IVar17 = GAme;
              for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
                lVar23 = (long)GA[g_a + 1000].nblock[lVar18];
                lVar19 = IVar17 % lVar23;
                pCVar10 = GA[lVar1].mapc;
                plo_loc[lVar18 + -0x20] = pCVar10[lVar19 + lVar21];
                if (lVar19 == lVar23 + -1) {
                  CVar25 = GA[g_a + 1000].dims[lVar18];
                }
                else {
                  CVar25 = pCVar10[lVar19 + lVar21 + 1] + -1;
                }
                lVar21 = lVar21 + lVar23;
                _hi[lVar18] = CVar25;
                IVar17 = IVar17 / lVar23;
              }
            }
          }
          else {
            iVar33 = 0;
            if (0 < (short)uVar20) {
              iVar33 = (int)(short)uVar20;
            }
            for (lVar22 = 0; iVar33 != lVar22; lVar22 = lVar22 + 1) {
              plo_loc[lVar22 + -0x20] = 0;
              _hi[lVar22] = -1;
            }
          }
        }
        lVar22 = lVar26 + -1;
        if (lVar22 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        local_5b0 = (double *)(plVar4 + 1);
        if (lVar22 < 1) {
          lVar22 = 0;
        }
        lVar21 = 1;
        lVar18 = 0;
        for (lVar19 = 0; lVar22 != lVar19; lVar19 = lVar19 + 1) {
          lVar18 = lVar18 + plo_loc[lVar19] * lVar21;
          lVar23 = (_hi[lVar19] - plo_loc[lVar19 + -0x20]) + GA[g_a + 1000].width[lVar19] * 2 + 1;
          ld_loc[lVar19] = lVar23;
          lVar21 = lVar21 * lVar23;
        }
        plVar3[2] = (long)(GA[lVar1].ptr[GAme] +
                          (long)GA[lVar1].elemsize * (lVar21 * plo_loc[lVar26 + -1] + lVar18));
        uVar20 = GA[lVar1].ndim;
        lVar26 = (long)(short)uVar20;
        iVar33 = GA[lVar1].distr_type;
        if (iVar33 - 1U < 3) {
          lVar22 = *plVar4;
          lVar18 = (long)(int)lVar22 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar18;
          lVar21 = 0;
          while (lVar21 + 1 < lVar26) {
            lVar22 = (long)((int)lVar22 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar21];
            lVar18 = (long)(int)lVar22 % GA[g_a + 1000].num_blocks[lVar21 + 1];
            _index[lVar21 + 1] = (int)lVar18;
            lVar21 = lVar21 + 1;
          }
          uVar12 = 0;
          if (0 < (short)uVar20) {
            uVar12 = uVar20;
          }
          for (lVar22 = 0; (ulong)uVar12 * 4 != lVar22; lVar22 = lVar22 + 4) {
            iVar33 = *(int *)((long)_index + lVar22);
            lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar22 * 2);
            *(long *)(err_string + lVar22 * 2) = lVar21 * iVar33 + 1;
            lVar21 = ((long)iVar33 + 1) * lVar21;
            lVar18 = *(long *)((long)GA[g_a + 1000].dims + lVar22 * 2);
            if (lVar18 <= lVar21) {
              lVar21 = lVar18;
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar21;
          }
        }
        else if (iVar33 == 4) {
          lVar22 = *plVar4;
          lVar18 = (long)(int)lVar22 % GA[lVar1].num_blocks[0];
          _index[0] = (int)lVar18;
          lVar21 = 0;
          while (lVar21 + 1 < lVar26) {
            lVar22 = (long)((int)lVar22 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar21];
            lVar18 = (long)(int)lVar22 % GA[g_a + 1000].num_blocks[lVar21 + 1];
            _index[lVar21 + 1] = (int)lVar18;
            lVar21 = lVar21 + 1;
          }
          lVar22 = 0;
          uVar12 = 0;
          if (0 < (short)uVar20) {
            uVar12 = uVar20;
          }
          iVar33 = 0;
          for (; (ulong)uVar12 * 4 != lVar22; lVar22 = lVar22 + 4) {
            pCVar10 = GA[lVar1].mapc;
            iVar32 = *(int *)((long)_index + lVar22);
            lVar18 = (long)iVar33 + (long)iVar32;
            *(C_Integer *)(err_string + lVar22 * 2) = pCVar10[lVar18];
            lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar22 * 2);
            if ((long)iVar32 < lVar21 + -1) {
              lVar18 = pCVar10[lVar18 + 1] + -1;
            }
            else {
              lVar18 = *(long *)((long)GA[lVar1].dims + lVar22 * 2);
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar18;
            iVar33 = iVar33 + (int)lVar21;
          }
        }
        else if (iVar33 == 0) {
          if (GA[lVar1].num_rstrctd == 0) {
            lVar22 = 0;
            if (0 < lVar26) {
              lVar22 = lVar26;
            }
            lVar21 = 1;
            for (lVar18 = 0; lVar22 != lVar18; lVar18 = lVar18 + 1) {
              lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar18];
            }
            lVar18 = *plVar4;
            if (lVar18 < lVar21 && -1 < lVar18) {
              lVar21 = 0;
              for (lVar19 = 0; lVar22 != lVar19; lVar19 = lVar19 + 1) {
                lVar28 = (long)GA[g_a + 1000].nblock[lVar19];
                lVar23 = lVar18 % lVar28;
                pCVar10 = GA[lVar1].mapc;
                plo_loc[lVar19 + -0x20] = pCVar10[lVar23 + lVar21];
                if (lVar23 == lVar28 + -1) {
                  CVar25 = GA[g_a + 1000].dims[lVar19];
                }
                else {
                  CVar25 = pCVar10[lVar23 + lVar21 + 1] + -1;
                }
                lVar21 = lVar21 + lVar28;
                _hi[lVar19] = CVar25;
                lVar18 = lVar18 / lVar28;
              }
            }
            else {
              for (lVar21 = 0; lVar22 != lVar21; lVar21 = lVar21 + 1) {
                plo_loc[lVar21 + -0x20] = 0;
                _hi[lVar21] = -1;
              }
            }
          }
          else {
            lVar22 = *plVar4;
            if (lVar22 < GA[lVar1].num_rstrctd) {
              lVar21 = 0;
              if (0 < lVar26) {
                lVar21 = lVar26;
              }
              lVar18 = 1;
              for (lVar19 = 0; lVar21 != lVar19; lVar19 = lVar19 + 1) {
                lVar18 = lVar18 * GA[g_a + 1000].nblock[lVar19];
              }
              if ((lVar22 < 0) || (lVar18 <= lVar22)) {
                for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
                  plo_loc[lVar22 + -0x20] = 0;
                  _hi[lVar22] = -1;
                }
              }
              else {
                lVar18 = 0;
                for (lVar19 = 0; lVar21 != lVar19; lVar19 = lVar19 + 1) {
                  lVar28 = (long)GA[g_a + 1000].nblock[lVar19];
                  lVar23 = lVar22 % lVar28;
                  pCVar10 = GA[lVar1].mapc;
                  plo_loc[lVar19 + -0x20] = pCVar10[lVar23 + lVar18];
                  if (lVar23 == lVar28 + -1) {
                    CVar25 = GA[g_a + 1000].dims[lVar19];
                  }
                  else {
                    CVar25 = pCVar10[lVar23 + lVar18 + 1] + -1;
                  }
                  lVar18 = lVar18 + lVar28;
                  _hi[lVar19] = CVar25;
                  lVar22 = lVar22 / lVar28;
                }
              }
            }
            else {
              iVar33 = 0;
              if (0 < (short)uVar20) {
                iVar33 = (int)(short)uVar20;
              }
              for (lVar22 = 0; iVar33 != lVar22; lVar22 = lVar22 + 1) {
                plo_loc[lVar22 + -0x20] = 0;
                _hi[lVar22] = -1;
              }
            }
          }
        }
        lVar22 = lVar26 + -1;
        if (lVar22 == 0) {
          ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
        }
        if (lVar22 < 1) {
          lVar22 = 0;
        }
        lVar21 = 1;
        lVar18 = 0;
        for (lVar19 = 0; lVar22 != lVar19; lVar19 = lVar19 + 1) {
          lVar18 = lVar18 + plo_rem[lVar19] * lVar21;
          lVar23 = (_hi[lVar19] - plo_loc[lVar19 + -0x20]) + GA[g_a + 1000].width[lVar19] * 2 + 1;
          ld_rem[lVar19] = lVar23;
          lVar21 = lVar21 * lVar23;
        }
        plVar3[1] = (long)(GA[lVar1].ptr[*plVar4] +
                          (long)GA[lVar1].elemsize * (lVar21 * plo_rem[lVar26 + -1] + lVar18));
        *(int *)(plVar3 + 3) = iVar6;
        *piVar27 = iVar6;
        for (lVar26 = 0; lVar15 != lVar26; lVar26 = lVar26 + 4) {
          *(int *)((long)piVar27 + lVar26) =
               *(int *)((long)piVar27 + lVar26) * *(int *)((long)ld_rem + lVar26 * 2);
          *(int *)((long)plVar3 + lVar26 + 0x18) =
               *(int *)((long)plVar3 + lVar26 + 0x18) * *(int *)((long)ld_loc + lVar26 * 2);
          *(undefined4 *)((long)plVar3 + lVar26 + ndim * 4 + 0x1c) =
               *(undefined4 *)((long)piVar27 + lVar26);
          *(undefined4 *)((long)plVar3 + lVar26 + 0x1c) =
               *(undefined4 *)((long)plVar3 + lVar26 + 0x18);
        }
        for (lVar26 = 0; lVar34 != lVar26; lVar26 = lVar26 + 1) {
          piVar2[lVar26] = ((int)phi_rem[lVar26] - (int)plo_rem[lVar26]) + 1;
        }
        *piVar2 = *piVar2 * iVar6;
        if (-1 < iVar5) {
          *plVar4 = (long)PGRP_LIST[iVar5].inv_map_proc_list[*plVar4];
        }
        if (iVar7 != 0) {
          increment[IVar31] = lVar9 * 2;
        }
      }
    }
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_set_update5_info(Integer g_a)
{
  int i;
  Integer *proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM],np;
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int *stride_loc, *stride_rem,*count;
  int idx, corner_flag;
  char **ptr_loc, **ptr_rem,*cache;
  Integer handle = GA_OFFSET + g_a;
  int cache_size;
#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  int scope;
#endif
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets up the arrays that are used to transfer data
   * using the update5 algorithm. The arrays begining with the character
   * "p" represent relative indices marking the location of the data set
   * relative to the origin the local patch of the global array, all
   * other indices are in absolute coordinates and mark locations in the
   * total global array. The indices used by this routine are described
   * below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  size = GA[handle].elemsize;
  cache_size = 2*sizeof(char *)+3*sizeof(int)+sizeof(Integer);
  cache_size = 2*ndim*((cache_size/sizeof(double)) + 1);
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  corner_flag = GA[handle].corner_flag;

  pnga_distribution(g_a,me,lo_loc,hi_loc); 
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1){
      *(char **)cache = NULL; 
      return FALSE;
    }
  } 

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update5_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update5_info:malloc failed (_ga_proclist)",0);

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  for(scope=0;scope < 2; scope ++)
#endif
    for (idx=0; idx < ndim; idx++) {
      nwidth = width[idx];
      if (nwidth != 0) {  
      
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          goto do_negative;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);
        

        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }
        gam_LocationWithGhosts(me, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);
 
        /* Evaluate strides on local and remote processors */
        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);
        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        do_negative:
#endif

       /*BJP proc_rem++; */
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);

        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          continue;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);



        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = 0;
              phi_rem[i] = width[i] - 1;
              plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }


        gam_LocationWithGhosts(GAme, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);

        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);

        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

        if (corner_flag)
          increment[idx] = 2*nwidth;
      }
    }
    free(_ga_map);
    free(_ga_proclist);
    return TRUE;
}